

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

void __thiscall test::test_load_and_export_private::test_method(test_load_and_export_private *this)

{
  unit_test_log_t *puVar1;
  __type pv_;
  bool bVar2;
  pointer pCVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> *Loc;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]> local_110;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  assertion_result local_a0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  algorithm local_68 [8];
  string pk_exported;
  algorithm local_38 [8];
  string pk_str;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  test_load_and_export_private *this_local;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&pk_str.field_2 + 8));
  (*pCVar3->_vptr_CryptoHelper[4])(pCVar3,local_38);
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&pk_str.field_2 + 8));
  (*pCVar3->_vptr_CryptoHelper[1])(local_68);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    Loc = &local_88;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_78,0x46);
    std::locale::locale((locale *)local_c8);
    boost::algorithm::trim_copy<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 8),
               local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c8,(locale *)Loc);
    std::locale::locale((locale *)local_f0);
    boost::algorithm::trim_copy<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f0 + 8),
               local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0,(locale *)Loc);
    pv_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_c8 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_f0 + 8));
    boost::test_tools::assertion_result::assertion_result(&local_a0,pv_);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_110,prev,(char (*) [40])"imported and exported keys are the same");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_a0,&local_110,&local_120,0x46,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]>::
    ~lazy_ostream_impl(&local_110);
    boost::test_tools::assertion_result::~assertion_result(&local_a0);
    std::__cxx11::string::~string((string *)(local_f0 + 8));
    std::locale::~locale((locale *)local_f0);
    std::__cxx11::string::~string((string *)(local_c8 + 8));
    std::locale::~locale((locale *)local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::release
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             ((long)&pk_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             ((long)&pk_str.field_2 + 8));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_export_private) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	std::string pk_exported = crypto->exportPrivateKey();
	// cout<<pk_str<<endl;
	// cout<<pk_exported<<endl;
	BOOST_CHECK_MESSAGE(boost::trim_copy(pk_exported) == boost::trim_copy(pk_str),
						"imported and exported keys are the same");
	crypto.release();
}